

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

size_t release_unused_segments(mstate m)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  void *pvVar8;
  long *plVar9;
  long in_RDI;
  bool bVar10;
  tchunkptr F_1;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I;
  tbinptr *H_1;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr tp;
  size_t psize;
  mchunkptr p;
  msegmentptr next;
  size_t size;
  char *base;
  msegmentptr sp;
  msegmentptr pred;
  size_t nsegs;
  size_t released;
  ulong local_100;
  size_t in_stack_ffffffffffffff08;
  void *in_stack_ffffffffffffff10;
  ulong local_e0;
  long local_c0;
  long local_b8;
  ulong local_a8;
  long *local_80;
  long *local_78;
  long local_68;
  long *local_28;
  long *local_20;
  ulong local_18;
  size_t local_10;
  
  local_10 = 0;
  local_18 = 0;
  local_20 = (long *)(in_RDI + 0x348);
  local_28 = *(long **)(in_RDI + 0x358);
  do {
    if (local_28 == (long *)0x0) {
      if (local_18 < 0x100) {
        local_100 = 0xff;
      }
      else {
        local_100 = local_18;
      }
      *(ulong *)(in_RDI + 0x30) = local_100;
      return local_10;
    }
    lVar1 = *local_28;
    lVar2 = local_28[1];
    plVar3 = (long *)local_28[2];
    local_18 = local_18 + 1;
    if ((lVar1 + 0x10U & 7) == 0) {
      local_e0 = 0;
    }
    else {
      local_e0 = 8 - (lVar1 + 0x10U & 7) & 7;
    }
    lVar7 = lVar1 + local_e0;
    pvVar8 = (void *)(*(ulong *)(lVar7 + 8) & 0xfffffffffffffffc);
    if (((*(ulong *)(lVar7 + 8) & 2) == 0) &&
       ((lVar1 + lVar2) - 0x40U <= (ulong)(lVar7 + (long)pvVar8))) {
      if (lVar7 == *(long *)(in_RDI + 0x18)) {
        *(undefined8 *)(in_RDI + 0x18) = 0;
        *(undefined8 *)(in_RDI + 8) = 0;
      }
      else {
        lVar1 = *(long *)(lVar7 + 0x30);
        if (*(long *)(lVar7 + 0x18) == lVar7) {
          local_78 = (long *)(lVar7 + 0x28);
          local_68 = *(long *)(lVar7 + 0x28);
          if (local_68 == 0) {
            local_78 = (long *)(lVar7 + 0x20);
            local_68 = *(long *)(lVar7 + 0x20);
            if (local_68 == 0) goto LAB_0015c759;
          }
          while( true ) {
            local_80 = (long *)(local_68 + 0x28);
            bVar10 = true;
            if (*(long *)(local_68 + 0x28) == 0) {
              local_80 = (long *)(local_68 + 0x20);
              bVar10 = *(long *)(local_68 + 0x20) != 0;
            }
            if (!bVar10) break;
            local_78 = local_80;
            local_68 = *local_80;
          }
          *local_78 = 0;
        }
        else {
          lVar4 = *(long *)(lVar7 + 0x10);
          local_68 = *(long *)(lVar7 + 0x18);
          *(long *)(lVar4 + 0x18) = local_68;
          *(long *)(local_68 + 0x10) = lVar4;
        }
LAB_0015c759:
        if (lVar1 != 0) {
          plVar9 = (long *)(in_RDI + 0x248 + *(long *)(lVar7 + 0x38) * 8);
          if (lVar7 == *plVar9) {
            *plVar9 = local_68;
            if (local_68 == 0) {
              *(uint *)(in_RDI + 4) =
                   (1 << ((byte)*(undefined8 *)(lVar7 + 0x38) & 0x1f) ^ 0xffffffffU) &
                   *(uint *)(in_RDI + 4);
            }
          }
          else if (*(long *)(lVar1 + 0x20) == lVar7) {
            *(long *)(lVar1 + 0x20) = local_68;
          }
          else {
            *(long *)(lVar1 + 0x28) = local_68;
          }
          if (local_68 != 0) {
            *(long *)(local_68 + 0x30) = lVar1;
            lVar1 = *(long *)(lVar7 + 0x20);
            if (lVar1 != 0) {
              *(long *)(local_68 + 0x20) = lVar1;
              *(long *)(lVar1 + 0x30) = local_68;
            }
            lVar1 = *(long *)(lVar7 + 0x28);
            if (lVar1 != 0) {
              *(long *)(local_68 + 0x28) = lVar1;
              *(long *)(lVar1 + 0x30) = local_68;
            }
          }
        }
      }
      iVar5 = CALL_MUNMAP(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      if (iVar5 == 0) {
        local_10 = lVar2 + local_10;
        local_28 = local_20;
        local_20[2] = (long)plVar3;
      }
      else {
        uVar6 = (uint)((ulong)pvVar8 >> 8);
        if (uVar6 == 0) {
          local_a8 = 0;
        }
        else if (uVar6 < 0x10000) {
          iVar5 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          local_a8 = (ulong)(uint)(iVar5 << 1) + ((ulong)pvVar8 >> ((char)iVar5 + 7U & 0x3f) & 1);
        }
        else {
          local_a8 = 0x1f;
        }
        plVar9 = (long *)(in_RDI + 0x248 + local_a8 * 8);
        *(ulong *)(lVar7 + 0x38) = local_a8;
        *(undefined8 *)(lVar7 + 0x28) = 0;
        *(undefined8 *)(lVar7 + 0x20) = 0;
        if ((*(uint *)(in_RDI + 4) & 1 << ((byte)local_a8 & 0x1f)) == 0) {
          *(uint *)(in_RDI + 4) = 1 << ((byte)local_a8 & 0x1f) | *(uint *)(in_RDI + 4);
          *plVar9 = lVar7;
          *(long **)(lVar7 + 0x30) = plVar9;
          *(long *)(lVar7 + 0x18) = lVar7;
          *(long *)(lVar7 + 0x10) = lVar7;
        }
        else {
          local_b8 = *plVar9;
          if (local_a8 == 0x1f) {
            in_stack_ffffffffffffff08 = 0;
          }
          else {
            in_stack_ffffffffffffff08 = 0x3f - ((local_a8 >> 1) + 6);
          }
          local_c0 = (long)pvVar8 << ((byte)in_stack_ffffffffffffff08 & 0x3f);
          while (in_stack_ffffffffffffff10 = pvVar8,
                (void *)(*(ulong *)(local_b8 + 8) & 0xfffffffffffffffc) != pvVar8) {
            plVar9 = (long *)(local_b8 + 0x20 + (local_c0 >> 0x3f) * -8);
            local_c0 = local_c0 << 1;
            if (*plVar9 == 0) {
              *plVar9 = lVar7;
              *(long *)(lVar7 + 0x30) = local_b8;
              *(long *)(lVar7 + 0x18) = lVar7;
              *(long *)(lVar7 + 0x10) = lVar7;
              goto LAB_0015cbd4;
            }
            local_b8 = *plVar9;
          }
          lVar1 = *(long *)(local_b8 + 0x10);
          *(long *)(lVar1 + 0x18) = lVar7;
          *(long *)(local_b8 + 0x10) = lVar7;
          *(long *)(lVar7 + 0x10) = lVar1;
          *(long *)(lVar7 + 0x18) = local_b8;
          *(undefined8 *)(lVar7 + 0x30) = 0;
        }
      }
    }
LAB_0015cbd4:
    local_20 = local_28;
    local_28 = plVar3;
  } while( true );
}

Assistant:

static size_t release_unused_segments(mstate m)
{
  size_t released = 0;
  size_t nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char *base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    nsegs++;
    {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!cinuse(p) && (char *)p + psize >= base + size - TOP_FOOT_SIZE) {
	tchunkptr tp = (tchunkptr)p;
	if (p == m->dv) {
	  m->dv = 0;
	  m->dvsize = 0;
	} else {
	  unlink_large_chunk(m, tp);
	}
	if (CALL_MUNMAP(base, size) == 0) {
	  released += size;
	  /* unlink obsoleted record */
	  sp = pred;
	  sp->next = next;
	} else { /* back out if cannot unmap */
	  insert_large_chunk(m, tp, psize);
	}
      }
    }
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = nsegs > MAX_RELEASE_CHECK_RATE ?
		      nsegs : MAX_RELEASE_CHECK_RATE;
  return released;
}